

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CastExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CastExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ParenthesizedExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,
          ParenthesizedExpressionSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  CastExpressionSyntax *pCVar6;
  
  pCVar6 = (CastExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CastExpressionSyntax *)this->endPtr < pCVar6 + 1) {
    pCVar6 = (CastExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pCVar6 + 1);
  }
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pCVar6->super_ExpressionSyntax).super_SyntaxNode.kind = CastExpression;
  (pCVar6->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar6->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar6->left).ptr = args;
  (pCVar6->apostrophe).kind = TVar2;
  (pCVar6->apostrophe).field_0x2 = uVar3;
  (pCVar6->apostrophe).numFlags = (NumericTokenFlags)NVar4.raw;
  (pCVar6->apostrophe).rawLen = uVar5;
  (pCVar6->apostrophe).info = pIVar1;
  (pCVar6->right).ptr = args_2;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pCVar6;
  (args_2->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)pCVar6;
  return pCVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }